

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::LoopLayerParams::ByteSizeLong(LoopLayerParams *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  string *value;
  uint64 uVar4;
  size_t sVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  LoopLayerParams *this_local;
  
  sStack_18 = 0;
  conditionvar_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    value = conditionvar_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_conditionnetwork(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->conditionnetwork_);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  bVar1 = has_bodynetwork(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->bodynetwork_);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  uVar4 = maxloopiterations(this);
  if (uVar4 != 0) {
    uVar4 = maxloopiterations(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar4);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t LoopLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LoopLayerParams)
  size_t total_size = 0;

  // string conditionVar = 2;
  if (this->conditionvar().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->conditionvar());
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->has_conditionnetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->conditionnetwork_);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->has_bodynetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bodynetwork_);
  }

  // uint64 maxLoopIterations = 1;
  if (this->maxloopiterations() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->maxloopiterations());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}